

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

AssertionResult __thiscall
testing::internal::CmpHelperSTREQ
          (internal *this,char *expected_expression,char *actual_expression,wchar_t *expected,
          wchar_t *actual)

{
  wchar_t *actual_expression_00;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  AssertionResult AVar3;
  String *this_00;
  String local_50;
  String local_40;
  wchar_t *local_30;
  wchar_t *actual_local;
  wchar_t *expected_local;
  char *actual_expression_local;
  char *expected_expression_local;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  
  local_30 = actual;
  actual_local = expected;
  expected_local = (wchar_t *)actual_expression;
  actual_expression_local = expected_expression;
  expected_expression_local = (char *)this;
  bVar1 = String::WideCStringEquals(expected,actual);
  actual_expression_00 = expected_local;
  if (bVar1) {
    AVar3 = AssertionSuccess();
    sVar2 = AVar3.message_.ptr_;
  }
  else {
    this_00 = (String *)actual_expression_local;
    String::ShowWideCStringQuoted(&local_40,actual_local);
    String::ShowWideCStringQuoted(&local_50,local_30);
    EqFailure(this,(char *)this_00,(char *)actual_expression_00,&local_40,&local_50,false);
    String::~String(this_00);
    String::~String(this_00);
    sVar2.ptr_ = extraout_RDX;
  }
  AVar3.message_.ptr_ = sVar2.ptr_;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

AssertionResult CmpHelperSTREQ(const char* expected_expression,
                               const char* actual_expression,
                               const wchar_t* expected,
                               const wchar_t* actual) {
  if (String::WideCStringEquals(expected, actual)) {
    return AssertionSuccess();
  }

  return EqFailure(expected_expression,
                   actual_expression,
                   String::ShowWideCStringQuoted(expected),
                   String::ShowWideCStringQuoted(actual),
                   false);
}